

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_vec2 nk_widget_size(nk_context *ctx)

{
  nk_vec2 nVar1;
  nk_rect bounds;
  undefined1 local_18 [16];
  
  nVar1.x = 0.0;
  nVar1.y = 0.0;
  if ((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) {
    nk_layout_peek((nk_rect *)local_18,ctx);
    nVar1 = (nk_vec2)local_18._8_8_;
  }
  return nVar1;
}

Assistant:

NK_API struct nk_vec2
nk_widget_size(struct nk_context *ctx)
{
struct nk_rect bounds;
NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
if (!ctx || !ctx->current)
return nk_vec2(0,0);

nk_layout_peek(&bounds, ctx);
return nk_vec2(bounds.w, bounds.h);
}